

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
DynamicHistogram<double>::cdf
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          DynamicHistogram<double> *this)

{
  iterator iVar1;
  bool bVar2;
  uint uVar3;
  runtime_error *this_00;
  reference pdVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  iterator it;
  double sum;
  DynamicHistogram<double> *this_local;
  vector<double,_std::allocator<double>_> *prob;
  
  uVar3 = (*this->_vptr_DynamicHistogram[2])();
  if ((uVar3 & 1) != 0) {
    pdf(__return_storage_ptr__,this);
    it._M_current = (double *)0x0;
    local_38._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
    while( true ) {
      local_40._M_current =
           (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
      bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
      iVar1 = it;
      if (!bVar2) break;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_38);
      *pdVar4 = (double)iVar1._M_current + *pdVar4;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_38);
      it._M_current = (double *)*pdVar4;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_38);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::cdf - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<double>
    cdf()
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::cdf - Histogram could not be initialized.");

        std::vector<double> prob = this->pdf();

        double sum = 0;
        for (std::vector<double>::iterator it = prob.begin(); it != prob.end(); ++it)
        {
            *it += sum;
            sum = *it;
        }

        return prob;

    }